

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_init_var_test(btree_kv_ops *kv_ops)

{
  uint __line;
  char *pcVar1;
  char local_88 [16];
  char local_78 [16];
  timeval __test_begin;
  btree local_58;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  (*kv_ops->init_kv_var)(&local_58,(void *)0x0,(void *)0x0);
  local_58.ksize = '\b';
  local_58.vsize = '\b';
  (*kv_ops->init_kv_var)(&local_58,local_78,local_88);
  if (local_78[0] != '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x55);
    kv_init_var_test(btree_kv_ops*)::__test_pass = '\x01';
    if (local_78[0] != '\0') {
      pcVar1 = "*(uint8_t *)key == 0";
      __line = 0x55;
      goto LAB_001015bc;
    }
  }
  if (local_88[0] != '\0') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x56);
    kv_init_var_test(btree_kv_ops*)::__test_pass = '\x01';
    if (local_88[0] != '\0') {
      pcVar1 = "*(uint8_t *)value == 0";
      __line = 0x56;
LAB_001015bc:
      kv_init_var_test(btree_kv_ops*)::__test_pass = 1;
      __assert_fail(pcVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,__line,"void kv_init_var_test(btree_kv_ops *)");
    }
  }
  memleak_end();
  pcVar1 = "%s PASSED\n";
  if (kv_init_var_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar1 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar1,"kv init var test");
  return;
}

Assistant:

void kv_init_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();
    void *key, *value;
    btree *tree = alca(struct btree, 1);
    uint8_t ksize = 8;
    uint8_t vsize = 8;

    // unintialized key/value
    key = NULL;
    value = NULL;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK(key == NULL);
    TEST_CHK(value == NULL);

    // initialized
    key = (void *)alca(uint8_t, ksize);
    value = (void *)alca(uint8_t, vsize);
    tree->ksize = ksize;
    tree->vsize = vsize;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK( *(uint8_t *)key == 0 );
    TEST_CHK( *(uint8_t *)value == 0 );

    memleak_end();
    TEST_RESULT("kv init var test");
}